

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O0

bool __thiscall jpge::jpeg_encoder::process_scanline(jpeg_encoder *this,void *pScanline)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  void *in_stack_00000008;
  bool local_1;
  
  if ((*(char *)(in_RDI + 0x34b4) == '\0') || (2 < *(byte *)(in_RDI + 0x34b4))) {
    local_1 = false;
  }
  else {
    if ((*(byte *)(in_RDI + 0x34b5) & 1) != 0) {
      if (in_RSI == 0) {
        bVar1 = process_end_of_image((jpeg_encoder *)0x0);
        if (!bVar1) {
          return false;
        }
      }
      else {
        load_mcu((jpeg_encoder *)pScanline,in_stack_00000008);
      }
    }
    local_1 = (bool)(*(byte *)(in_RDI + 0x34b5) & 1);
  }
  return local_1;
}

Assistant:

bool jpeg_encoder::process_scanline(const void* pScanline) {
  if ((m_pass_num < 1) || (m_pass_num > 2))
    return false;
  if (m_all_stream_writes_succeeded) {
    if (!pScanline) {
      if (!process_end_of_image())
        return false;
    } else {
      load_mcu(pScanline);
    }
  }
  return m_all_stream_writes_succeeded;
}